

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O2

int verify_miniscript_wrapper_n(miniscript_node_t *node,miniscript_node_t *parent)

{
  if ((node->type_properties & 1) == 0) {
    return -2;
  }
  node->type_properties = node->type_properties & 0x7def0f | 0x20000;
  return 0;
}

Assistant:

static int verify_miniscript_wrapper_n(struct miniscript_node_t *node, struct miniscript_node_t *parent)
{
    (void)parent;
    if (!(node->type_properties & MINISCRIPT_TYPE_B))
        return WALLY_EINVAL;

    node->type_properties &= MINISCRIPT_TYPE_MASK | MINISCRIPT_PROPERTY_Z |
                             MINISCRIPT_PROPERTY_O | MINISCRIPT_PROPERTY_N |
                             MINISCRIPT_PROPERTY_D | MINISCRIPT_PROPERTY_F |
                             MINISCRIPT_PROPERTY_E | MINISCRIPT_PROPERTY_M |
                             MINISCRIPT_PROPERTY_S |
                             MINISCRIPT_PROPERTY_G | MINISCRIPT_PROPERTY_H |
                             MINISCRIPT_PROPERTY_I | MINISCRIPT_PROPERTY_J |
                             MINISCRIPT_PROPERTY_K;
    node->type_properties |= MINISCRIPT_PROPERTY_X;
    return WALLY_OK;
}